

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O3

int trico_read_stl_full(uint32_t *nr_of_vertices,float **vertices,uint32_t *nr_of_triangles,
                       uint32_t **triangles,float **normals,uint16_t **attributes,char *filename)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  uint32_t *puVar3;
  float *pfVar4;
  uint16_t *puVar5;
  float *pfVar6;
  uint32_t uVar7;
  long lVar8;
  size_t __size;
  long lVar9;
  char buffer [80];
  int local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined8 uStack_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  float local_5c;
  uint16_t local_58;
  
  *vertices = (float *)0x0;
  *triangles = (uint32_t *)0x0;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  __stream = fopen(filename,"rb");
  iVar2 = 0;
  if (__stream != (FILE *)0x0) {
    fread(&local_88,1,0x50,__stream);
    if ((local_88 == 0x696c6f73) && ((char)uStack_84 == 'd')) {
      fclose(__stream);
      iVar2 = 0;
    }
    else {
      fread(nr_of_triangles,4,1,__stream);
      uVar1 = *nr_of_triangles;
      __size = (ulong)(uVar1 * 3) << 2;
      puVar3 = (uint32_t *)malloc(__size);
      *triangles = puVar3;
      pfVar4 = (float *)malloc(__size);
      *normals = pfVar4;
      puVar5 = (uint16_t *)malloc((ulong)uVar1 * 2);
      *attributes = puVar5;
      *nr_of_vertices = 0;
      pfVar6 = (float *)malloc((ulong)(*nr_of_triangles * 9) << 2);
      *vertices = pfVar6;
      puVar3 = *triangles;
      pfVar4 = *normals;
      puVar5 = *attributes;
      iVar2 = feof(__stream);
      uVar7 = 0;
      if (iVar2 == 0) {
        lVar9 = 0;
        lVar8 = 0;
        do {
          if (*nr_of_triangles <= (uint)lVar8) break;
          fread(&local_88,1,0x32,__stream);
          *(ulong *)((long)pfVar4 + lVar9) = CONCAT44(uStack_84,local_88);
          *(undefined4 *)((long)pfVar4 + lVar9 + 8) = uStack_80;
          *(undefined8 *)pfVar6 = uStack_7c;
          *(undefined8 *)(pfVar6 + 2) = uStack_74;
          *(undefined8 *)(pfVar6 + 4) = local_6c;
          *(undefined8 *)(pfVar6 + 6) = uStack_64;
          pfVar6[8] = local_5c;
          puVar5[lVar8] = local_58;
          uVar7 = *nr_of_vertices;
          *nr_of_vertices = uVar7 + 1;
          *(uint32_t *)((long)puVar3 + lVar9) = uVar7;
          uVar7 = *nr_of_vertices;
          *nr_of_vertices = uVar7 + 1;
          *(uint32_t *)((long)puVar3 + lVar9 + 4) = uVar7;
          uVar7 = *nr_of_vertices;
          *nr_of_vertices = uVar7 + 1;
          *(uint32_t *)((long)puVar3 + lVar9 + 8) = uVar7;
          iVar2 = feof(__stream);
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0xc;
          pfVar6 = pfVar6 + 9;
        } while (iVar2 == 0);
        uVar7 = (uint32_t)lVar8;
      }
      fclose(__stream);
      iVar2 = 0;
      if (uVar7 == *nr_of_triangles) {
        trico_remove_duplicate_vertices(nr_of_vertices,vertices,uVar7,triangles);
        pfVar4 = (float *)realloc(*vertices,(ulong)(*nr_of_vertices * 3) << 2);
        *vertices = pfVar4;
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int trico_read_stl_full(uint32_t* nr_of_vertices, float** vertices, uint32_t* nr_of_triangles, uint32_t** triangles, float** normals, uint16_t** attributes, const char* filename)
  {
  *vertices = NULL;
  *triangles = NULL;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  FILE* inputfile = fopen(filename, "rb");
  if (!inputfile)
    return 0;

  if (!inputfile)
    return 0;

  char buffer[80];
  fread(buffer, 1, 80, inputfile);

  if (buffer[0] == 's' && buffer[1] == 'o' && buffer[2] == 'l' && buffer[3] == 'i' && buffer[4] == 'd')
    {
    fclose(inputfile);
    return 0;
    }

  fread((void*)(nr_of_triangles), sizeof(uint32_t), 1, inputfile);
  *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));
  *normals = (float*)trico_malloc(*nr_of_triangles * 3 * sizeof(float));
  *attributes = (uint16_t*)trico_malloc(*nr_of_triangles * sizeof(uint16_t));
  uint32_t count_triangles = 0;
  *nr_of_vertices = 0;
  *vertices = (float*)trico_malloc(*nr_of_triangles * 9 * sizeof(float));

  uint32_t* tria_it = *triangles;
  float* vert_it = *vertices;
  float* norm_it = *normals;
  uint16_t* attr_it = *attributes;
  while (!feof(inputfile) && count_triangles < *nr_of_triangles)
    {
    ++count_triangles;
    fread(buffer, 1, 50, inputfile);
    *norm_it++ = *(float*)(&(buffer[0]));
    *norm_it++ = *(float*)(&(buffer[4]));
    *norm_it++ = *(float*)(&(buffer[8]));
    *vert_it++ = *(float*)(&(buffer[12]));
    *vert_it++ = *(float*)(&(buffer[16]));
    *vert_it++ = *(float*)(&(buffer[20]));
    *vert_it++ = *(float*)(&(buffer[24]));
    *vert_it++ = *(float*)(&(buffer[28]));
    *vert_it++ = *(float*)(&(buffer[32]));
    *vert_it++ = *(float*)(&(buffer[36]));
    *vert_it++ = *(float*)(&(buffer[40]));
    *vert_it++ = *(float*)(&(buffer[44]));
    *attr_it++ = *(uint16_t*)(&(buffer[48]));
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    }
  fclose(inputfile);
  if (count_triangles != *nr_of_triangles)
    return 0;

  trico_remove_duplicate_vertices(nr_of_vertices, vertices, *nr_of_triangles, triangles);
  *vertices = (float*)trico_realloc(*vertices, *nr_of_vertices * 3 * sizeof(float));
  return 1;
  }